

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnSelectExpr
          (BinaryReaderInterp *this,Index result_count,Type *result_types)

{
  bool bVar1;
  Location local_50;
  Enum local_2c;
  Type *local_28;
  Type *result_types_local;
  BinaryReaderInterp *pBStack_18;
  Index result_count_local;
  BinaryReaderInterp *this_local;
  
  local_28 = result_types;
  result_types_local._4_4_ = result_count;
  pBStack_18 = this;
  GetLocation(&local_50,this);
  local_2c = (Enum)SharedValidator::OnSelect
                             (&this->validator_,&local_50,result_types_local._4_4_,local_28);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,Select);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnSelectExpr(Index result_count,
                                        Type* result_types) {
  CHECK_RESULT(validator_.OnSelect(GetLocation(), result_count, result_types));
  istream_.Emit(Opcode::Select);
  return Result::Ok;
}